

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkStrashBlifMv(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  void *__ptr;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  void *pvVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pObj_00;
  int local_a4;
  int i_1;
  Abc_Obj_t *pObjLo;
  Abc_Obj_t *pObjLi;
  Abc_Obj_t *pLatch;
  Vec_Ptr_t *vTemp;
  int nCount2;
  int nCount1;
  int nBits;
  int nValuesMax;
  int nValues;
  int v;
  int k;
  int i;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pBit;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t **pValues;
  Abc_Obj_t **pBits;
  Vec_Ptr_t *vNodes;
  int fUsePositional;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                  ,0x18a,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkHasBlifMv(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                  ,0x18b,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkWhiteboxNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                  ,0x18c,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkBlackboxNum(pNtk);
  if (iVar1 == 0) {
    nCount1 = 2;
    for (v = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), v < iVar1; v = v + 1) {
      pAVar4 = Abc_NtkObj(pNtk,v);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNet(pAVar4), iVar1 != 0)) &&
         (iVar1 = Abc_ObjMvVarNum(pAVar4), nCount1 < iVar1)) {
        nCount1 = iVar1;
      }
    }
    iVar1 = Abc_Base2Log(nCount1);
    __ptr = malloc((long)iVar1 << 3);
    Abc_NtkCleanCopy(pNtk);
    pVVar5 = Abc_NtkDfs(pNtk,0);
    pNtk_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    pcVar6 = Extra_UtilStrsav(pNtk->pName);
    pNtk_local->pName = pcVar6;
    vTemp._0_4_ = 0;
    vTemp._4_4_ = 0;
    Abc_NtkIncrementTravId(pNtk);
    for (v = 0; iVar1 = Abc_NtkCiNum(pNtk), v < iVar1; v = v + 1) {
      pAVar4 = Abc_NtkCi(pNtk,v);
      iVar1 = Abc_ObjIsPi(pAVar4);
      if (iVar1 != 0) {
        pAVar4 = Abc_ObjFanout0(pAVar4);
        uVar2 = Abc_ObjMvVarNum(pAVar4);
        pvVar7 = malloc((long)(int)uVar2 << 3);
        iVar1 = Abc_Base2Log(uVar2);
        for (nValues = 0; nValues < iVar1; nValues = nValues + 1) {
          pAVar8 = Abc_NtkCreatePi(pNtk_local);
          *(Abc_Obj_t **)((long)__ptr + (long)nValues * 8) = pAVar8;
          if (nCount1 == 2) {
            pAVar8 = *(Abc_Obj_t **)((long)__ptr + (long)nValues * 8);
            pcVar6 = Abc_ObjName(pAVar4);
            Abc_ObjAssignName(pAVar8,pcVar6,(char *)0x0);
          }
          else {
            Abc_NtkConvertAssignName
                      (*(Abc_Obj_t **)((long)__ptr + (long)nValues * 8),pAVar4,nValues);
          }
        }
        for (nValuesMax = 0; nValuesMax < (int)uVar2; nValuesMax = nValuesMax + 1) {
          pAVar8 = Abc_AigConst1(pNtk_local);
          *(Abc_Obj_t **)((long)pvVar7 + (long)nValuesMax * 8) = pAVar8;
          for (nValues = 0; nValues < iVar1; nValues = nValues + 1) {
            pAVar8 = Abc_ObjNotCond(*(Abc_Obj_t **)((long)__ptr + (long)nValues * 8),
                                    (uint)((nValuesMax & 1 << ((byte)nValues & 0x1f)) == 0));
            pAVar8 = Abc_AigAnd((Abc_Aig_t *)pNtk_local->pManFunc,
                                *(Abc_Obj_t **)((long)pvVar7 + (long)nValuesMax * 8),pAVar8);
            *(Abc_Obj_t **)((long)pvVar7 + (long)nValuesMax * 8) = pAVar8;
          }
        }
        (pAVar4->field_6).pTemp = pvVar7;
        Abc_NodeSetTravIdCurrent(pAVar4);
      }
    }
    for (v = 0; iVar1 = Abc_NtkCiNum(pNtk), v < iVar1; v = v + 1) {
      pAVar4 = Abc_NtkCi(pNtk,v);
      iVar1 = Abc_ObjIsPi(pAVar4);
      if (iVar1 == 0) {
        pAVar4 = Abc_ObjFanout0(pAVar4);
        uVar2 = Abc_ObjMvVarNum(pAVar4);
        pvVar7 = malloc((long)(int)uVar2 << 3);
        iVar1 = Abc_Base2Log(uVar2);
        for (nValues = 0; nValues < iVar1; nValues = nValues + 1) {
          pAVar8 = Abc_NtkCreateBo(pNtk_local);
          *(Abc_Obj_t **)((long)__ptr + (long)nValues * 8) = pAVar8;
          if (nCount1 == 2) {
            pAVar8 = *(Abc_Obj_t **)((long)__ptr + (long)nValues * 8);
            pcVar6 = Abc_ObjName(pAVar4);
            Abc_ObjAssignName(pAVar8,pcVar6,(char *)0x0);
          }
          else {
            Abc_NtkConvertAssignName
                      (*(Abc_Obj_t **)((long)__ptr + (long)nValues * 8),pAVar4,nValues);
          }
          vTemp._4_4_ = vTemp._4_4_ + 1;
        }
        for (nValuesMax = 0; nValuesMax < (int)uVar2; nValuesMax = nValuesMax + 1) {
          pAVar8 = Abc_AigConst1(pNtk_local);
          *(Abc_Obj_t **)((long)pvVar7 + (long)nValuesMax * 8) = pAVar8;
          for (nValues = 0; nValues < iVar1; nValues = nValues + 1) {
            pAVar8 = Abc_ObjNotCond(*(Abc_Obj_t **)((long)__ptr + (long)nValues * 8),
                                    (uint)((nValuesMax & 1 << ((byte)nValues & 0x1f)) == 0));
            pAVar8 = Abc_AigAnd((Abc_Aig_t *)pNtk_local->pManFunc,
                                *(Abc_Obj_t **)((long)pvVar7 + (long)nValuesMax * 8),pAVar8);
            *(Abc_Obj_t **)((long)pvVar7 + (long)nValuesMax * 8) = pAVar8;
          }
        }
        (pAVar4->field_6).pTemp = pvVar7;
        Abc_NodeSetTravIdCurrent(pAVar4);
      }
    }
    for (v = 0; iVar1 = Vec_PtrSize(pVVar5), v < iVar1; v = v + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(pVVar5,v);
      iVar1 = Abc_NodeStrashBlifMv(pNtk_local,pAVar4);
      if (iVar1 == 0) {
        Abc_NtkDelete(pNtk_local);
        return (Abc_Ntk_t *)0x0;
      }
    }
    Vec_PtrFree(pVVar5);
    for (v = 0; iVar1 = Abc_NtkCoNum(pNtk), v < iVar1; v = v + 1) {
      pAVar4 = Abc_NtkCo(pNtk,v);
      iVar1 = Abc_ObjIsPo(pAVar4);
      if (iVar1 != 0) {
        pAVar4 = Abc_ObjFanin0(pAVar4);
        uVar2 = Abc_ObjMvVarNum(pAVar4);
        pvVar7 = (pAVar4->field_6).pTemp;
        iVar1 = Abc_Base2Log(uVar2);
        for (nValues = 0; nValues < iVar1; nValues = nValues + 1) {
          pAVar8 = Abc_AigConst1(pNtk_local);
          pNet = Abc_ObjNot(pAVar8);
          for (nValuesMax = 0; nValuesMax < (int)uVar2; nValuesMax = nValuesMax + 1) {
            if ((nValuesMax & 1 << ((byte)nValues & 0x1f)) != 0) {
              pNet = Abc_AigOr((Abc_Aig_t *)pNtk_local->pManFunc,pNet,
                               *(Abc_Obj_t **)((long)pvVar7 + (long)nValuesMax * 8));
            }
          }
          pAVar8 = Abc_NtkCreatePo(pNtk_local);
          Abc_ObjAddFanin(pAVar8,pNet);
          if (nCount1 == 2) {
            pcVar6 = Abc_ObjName(pAVar4);
            Abc_ObjAssignName(pAVar8,pcVar6,(char *)0x0);
          }
          else {
            Abc_NtkConvertAssignName(pAVar8,pAVar4,nValues);
          }
        }
      }
    }
    for (v = 0; iVar1 = Abc_NtkCoNum(pNtk), v < iVar1; v = v + 1) {
      pAVar4 = Abc_NtkCo(pNtk,v);
      iVar1 = Abc_ObjIsPo(pAVar4);
      if (iVar1 == 0) {
        pAVar4 = Abc_ObjFanin0(pAVar4);
        uVar2 = Abc_ObjMvVarNum(pAVar4);
        pvVar7 = (pAVar4->field_6).pTemp;
        iVar1 = Abc_Base2Log(uVar2);
        for (nValues = 0; nValues < iVar1; nValues = nValues + 1) {
          pAVar8 = Abc_AigConst1(pNtk_local);
          pNet = Abc_ObjNot(pAVar8);
          for (nValuesMax = 0; nValuesMax < (int)uVar2; nValuesMax = nValuesMax + 1) {
            if ((nValuesMax & 1 << ((byte)nValues & 0x1f)) != 0) {
              pNet = Abc_AigOr((Abc_Aig_t *)pNtk_local->pManFunc,pNet,
                               *(Abc_Obj_t **)((long)pvVar7 + (long)nValuesMax * 8));
            }
          }
          pAVar8 = Abc_NtkCreateBi(pNtk_local);
          Abc_ObjAddFanin(pAVar8,pNet);
          if (nCount1 == 2) {
            pcVar6 = Abc_ObjName(pAVar4);
            Abc_ObjAssignName(pAVar8,pcVar6,(char *)0x0);
          }
          else {
            Abc_NtkConvertAssignName(pAVar8,pAVar4,nValues);
          }
          vTemp._0_4_ = (int)vTemp + 1;
        }
      }
    }
    iVar1 = Abc_NtkLatchNum(pNtk);
    if (iVar1 != 0) {
      iVar1 = Vec_PtrSize(pNtk_local->vPis);
      pVVar5 = Vec_PtrAlloc(iVar1);
      for (local_a4 = 0; iVar1 = Abc_NtkPiNum(pNtk_local), local_a4 < iVar1; local_a4 = local_a4 + 1
          ) {
        pAVar4 = Abc_NtkPi(pNtk_local,local_a4);
        pcVar6 = Abc_ObjName(pAVar4);
        iVar1 = strncmp(pcVar6,"free_var_",9);
        if (iVar1 == 0) {
          Vec_PtrPush(pVVar5,pAVar4);
        }
      }
      for (local_a4 = 0; iVar1 = Abc_NtkPiNum(pNtk_local), local_a4 < iVar1; local_a4 = local_a4 + 1
          ) {
        pAVar4 = Abc_NtkPi(pNtk_local,local_a4);
        pcVar6 = Abc_ObjName(pAVar4);
        iVar1 = strncmp(pcVar6,"free_var_",9);
        if (iVar1 != 0) {
          Vec_PtrPush(pVVar5,pAVar4);
        }
      }
      iVar1 = Vec_PtrSize(pVVar5);
      iVar3 = Vec_PtrSize(pNtk_local->vPis);
      if (iVar1 != iVar3) {
        __assert_fail("Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vPis)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0x299,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
      }
      Vec_PtrFree(pNtk_local->vPis);
      pNtk_local->vPis = pVVar5;
      iVar1 = Vec_PtrSize(pNtk_local->vCis);
      pVVar5 = Vec_PtrAlloc(iVar1);
      for (local_a4 = 0; iVar1 = Abc_NtkCiNum(pNtk_local), local_a4 < iVar1; local_a4 = local_a4 + 1
          ) {
        pAVar4 = Abc_NtkCi(pNtk_local,local_a4);
        pcVar6 = Abc_ObjName(pAVar4);
        iVar1 = strncmp(pcVar6,"free_var_",9);
        if (iVar1 == 0) {
          Vec_PtrPush(pVVar5,pAVar4);
        }
      }
      for (local_a4 = 0; iVar1 = Abc_NtkCiNum(pNtk_local), local_a4 < iVar1; local_a4 = local_a4 + 1
          ) {
        pAVar4 = Abc_NtkCi(pNtk_local,local_a4);
        pcVar6 = Abc_ObjName(pAVar4);
        iVar1 = strncmp(pcVar6,"free_var_",9);
        if (iVar1 != 0) {
          Vec_PtrPush(pVVar5,pAVar4);
        }
      }
      iVar1 = Vec_PtrSize(pVVar5);
      iVar3 = Vec_PtrSize(pNtk_local->vCis);
      if (iVar1 != iVar3) {
        __assert_fail("Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vCis)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0x2a4,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
      }
      Vec_PtrFree(pNtk_local->vCis);
      pNtk_local->vCis = pVVar5;
      if (vTemp._4_4_ != (int)vTemp) {
        __assert_fail("nCount1 == nCount2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0x2a8,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
      }
      for (local_a4 = 0; local_a4 < vTemp._4_4_; local_a4 = local_a4 + 1) {
        pAVar4 = Abc_NtkCreateLatch(pNtk_local);
        Abc_LatchSetInit0(pAVar4);
        pcVar6 = Abc_ObjName(pAVar4);
        Abc_ObjAssignName(pAVar4,pcVar6,(char *)0x0);
        iVar1 = Abc_NtkCoNum(pNtk_local);
        pAVar8 = Abc_NtkCo(pNtk_local,(iVar1 - vTemp._4_4_) + local_a4);
        iVar1 = Abc_NtkCiNum(pNtk_local);
        pObj_00 = Abc_NtkCi(pNtk_local,(iVar1 - vTemp._4_4_) + local_a4);
        Abc_ObjAddFanin(pAVar4,pAVar8);
        Abc_ObjAddFanin(pObj_00,pAVar4);
      }
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    for (v = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), v < iVar1; v = v + 1) {
      pAVar4 = Abc_NtkObj(pNtk,v);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && ((pAVar4->field_6).pTemp != (void *)0x0)) &&
         ((pAVar4->field_6).pTemp != (void *)0x0)) {
        free((pAVar4->field_6).pTemp);
        (pAVar4->field_6).pTemp = (void *)0x0;
      }
    }
    Abc_AigCleanup((Abc_Aig_t *)pNtk_local->pManFunc);
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkStrashBlifMv(): Network check has failed.\n");
      Abc_NtkDelete(pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                ,0x18d,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkStrashBlifMv( Abc_Ntk_t * pNtk )
{
    int fUsePositional = 0;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t ** pBits;
    Abc_Obj_t ** pValues;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pTemp, * pBit, * pNet;
    int i, k, v, nValues, nValuesMax, nBits;
    int nCount1, nCount2;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );

    // get the largest number of values
    nValuesMax = 2;
    Abc_NtkForEachNet( pNtk, pObj, i )
    {
        nValues = Abc_ObjMvVarNum(pObj);
        if ( nValuesMax < nValues )
            nValuesMax = nValues;
    }
    nBits = Abc_Base2Log( nValuesMax );
    pBits = ABC_ALLOC( Abc_Obj_t *, nBits );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // collect the nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
//    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pName );

    nCount1 = nCount2 = 0;
    // encode the CI nets
    Abc_NtkIncrementTravId( pNtk );
    if ( fUsePositional )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_NtkCreatePi( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pValues[v], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pValues[v], pNet, v );
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_NtkCreateBo( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pValues[v], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pValues[v], pNet, v );
                nCount1++;
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the encoding bits
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBits[k] = Abc_NtkCreatePi( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pBits[k], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pBits[k], pNet, k );
            }
            // encode the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_AigConst1(pNtkNew);
                for ( k = 0; k < nBits; k++ )
                {
                    pBit = Abc_ObjNotCond( pBits[k], (v&(1<<k)) == 0 );
                    pValues[v] = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[v], pBit );
                }
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the encoding bits
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBits[k] = Abc_NtkCreateBo( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pBits[k], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pBits[k], pNet, k );
                nCount1++;
            }
            // encode the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_AigConst1(pNtkNew);
                for ( k = 0; k < nBits; k++ )
                {
                    pBit = Abc_ObjNotCond( pBits[k], (v&(1<<k)) == 0 );
                    pValues[v] = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[v], pBit );
                }
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }

    // process nodes in the topological order
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Abc_NodeStrashBlifMv( pNtkNew, pObj ) )
        {
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
    Vec_PtrFree( vNodes );

    // encode the CO nets
    if ( fUsePositional )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            for ( v = 0; v < nValues; v++ )
            {
                pTemp = Abc_NtkCreatePo( pNtkNew );
                Abc_ObjAddFanin( pTemp, pValues[v] );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, v );
            }
        }
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            for ( v = 0; v < nValues; v++ )
            {
                pTemp = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pTemp, pValues[v] );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, v );
                nCount2++;
            }
        }
    }
    else // if ( fPositional == 0 )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBit = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    if ( v & (1<<k) )
                        pBit = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pBit, pValues[v] );
                pTemp = Abc_NtkCreatePo( pNtkNew );
                Abc_ObjAddFanin( pTemp, pBit );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, k );
            }
        }
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBit = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    if ( v & (1<<k) )
                        pBit = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pBit, pValues[v] );
                pTemp = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pTemp, pBit );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, k );
                nCount2++;
            }
        }
    }

    if ( Abc_NtkLatchNum(pNtk) )
    {
        Vec_Ptr_t * vTemp;
        Abc_Obj_t * pLatch, * pObjLi, * pObjLo;
        int i;
        // move free vars to the front among the PIs
        vTemp = Vec_PtrAlloc( Vec_PtrSize(pNtkNew->vPis) );
        Abc_NtkForEachPi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) == 0 )
                Vec_PtrPush( vTemp, pObj );
        Abc_NtkForEachPi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) != 0 )
                Vec_PtrPush( vTemp, pObj );
        assert( Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vPis) );
        Vec_PtrFree( pNtkNew->vPis );
        pNtkNew->vPis = vTemp;
        // move free vars to the front among the CIs
        vTemp = Vec_PtrAlloc( Vec_PtrSize(pNtkNew->vCis) );
        Abc_NtkForEachCi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) == 0 )
                Vec_PtrPush( vTemp, pObj );
        Abc_NtkForEachCi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) != 0 )
                Vec_PtrPush( vTemp, pObj );
        assert( Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vCis) );
        Vec_PtrFree( pNtkNew->vCis );
        pNtkNew->vCis = vTemp;
        // create registers
        assert( nCount1 == nCount2 );
        for ( i = 0; i < nCount1; i++ )
        {
            // create latch
            pLatch = Abc_NtkCreateLatch( pNtkNew );
            Abc_LatchSetInit0( pLatch );
            Abc_ObjAssignName( pLatch, Abc_ObjName(pLatch), NULL );
            // connect
            pObjLi = Abc_NtkCo( pNtkNew, Abc_NtkCoNum(pNtkNew)-nCount1+i );
            pObjLo = Abc_NtkCi( pNtkNew, Abc_NtkCiNum(pNtkNew)-nCount1+i );
            Abc_ObjAddFanin( pLatch, pObjLi );
            Abc_ObjAddFanin( pObjLo, pLatch );
        }
    }

    // cleanup
    ABC_FREE( pBits );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy )
            ABC_FREE( pObj->pCopy );

    // remove dangling nodes
    i = Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
//    printf( "Cleanup removed %d nodes.\n", i );
//    Abc_NtkReassignIds( pNtkNew );

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkStrashBlifMv(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}